

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O2

void __thiscall Imf_3_4::TiledInputFile::Data::Data(Data *this,Context *ctxt,int pN,int nT)

{
  _Rb_tree_header *p_Var1;
  V2f local_10;
  
  this->_ctxt = ctxt;
  this->partNumber = pN;
  this->numThreads = nT;
  local_10.x = 0.0;
  local_10.y = 0.0;
  Header::Header(&this->header,0x40,0x40,1.0,&local_10,1.0,INCREASING_Y,ZIP_COMPRESSION);
  this->header_filled = false;
  this->tile_x_size = 0;
  this->tile_y_size = 0;
  this->tile_level_mode = EXR_TILE_LAST_TYPE;
  this->tile_round_mode = EXR_TILE_ROUND_LAST_TYPE;
  this->num_x_levels = 0;
  this->num_y_levels = 0;
  (this->_tile_data_scratch).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_tile_data_scratch).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_tile_data_scratch).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->fill_list).super__Vector_base<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fill_list).super__Vector_base<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fill_list).super__Vector_base<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_failures).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_failures).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_failures).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_mx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_mx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->_mx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_mx).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->_mx).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  return;
}

Assistant:

Data (Context *ctxt, int pN, int nT)
    : _ctxt (ctxt)
    , partNumber (pN)
    , numThreads (nT)
    {}